

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

ssize_t __thiscall MemOStream::write(MemOStream *this,int __fd,void *__buf,size_t __n)

{
  uint64_t uVar1;
  size_type sVar2;
  runtime_error *this_00;
  char *pcVar3;
  int iVar4;
  undefined4 in_register_00000034;
  
  iVar4 = (int)__buf;
  uVar1 = this->streamptr;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->data);
  if (sVar2 < (long)iVar4 + uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"attempt to write beyond preallocated memory");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x11a333);
  memcpy(pcVar3 + this->streamptr,(void *)CONCAT44(in_register_00000034,__fd),(long)iVar4);
  this->streamptr = (long)iVar4 + this->streamptr;
  return (ssize_t)this;
}

Assistant:

void write (const char c[], int n) override
    {
        if (n + streamptr > data.size ())
        {
            throw runtime_error ("attempt to write beyond preallocated memory");
        }
        memcpy (data.data () + streamptr, c, n);
        streamptr += n;
    }